

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GPUShaderFP64Test7::getVariableDeclarations_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,char *prefix,
          _variables *variables,char *layout_qualifier)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  _variable_type type;
  undefined1 local_1f0 [8];
  string variable_type_string;
  _variable_type variable_type;
  uint variable_array_size;
  uint n_variable;
  size_t n_variables;
  stringstream result_sstream;
  ostream local_1a8;
  char *local_30;
  char *layout_qualifier_local;
  _variables *variables_local;
  char *prefix_local;
  GPUShaderFP64Test7 *this_local;
  
  local_30 = layout_qualifier;
  layout_qualifier_local = (char *)variables;
  variables_local = (_variables *)prefix;
  prefix_local = (char *)this;
  this_local = (GPUShaderFP64Test7 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&n_variables);
  sVar2 = std::
          vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
          ::size((vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                  *)layout_qualifier_local);
  for (variable_type = VARIABLE_TYPE_BOOL; variable_type < sVar2;
      variable_type = variable_type + VARIABLE_TYPE_BVEC2) {
    pvVar3 = std::
             vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             ::operator[]((vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                           *)layout_qualifier_local,(ulong)variable_type);
    uVar1 = pvVar3->array_size;
    pvVar3 = std::
             vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             ::operator[]((vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                           *)layout_qualifier_local,(ulong)variable_type);
    variable_type_string.field_2._12_4_ = pvVar3->type;
    Utils::getVariableTypeString_abi_cxx11_
              ((string *)local_1f0,(Utils *)(ulong)(uint)variable_type_string.field_2._12_4_,type);
    poVar4 = std::operator<<(&local_1a8,local_30);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(string *)local_1f0);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(char *)variables_local);
    poVar4 = std::operator<<(poVar4,"_variable");
    std::ostream::operator<<(poVar4,variable_type);
    if (1 < uVar1) {
      poVar4 = std::operator<<(&local_1a8,"[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
      std::operator<<(poVar4,"]");
    }
    std::operator<<(&local_1a8,";\n");
    std::__cxx11::string::~string((string *)local_1f0);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&n_variables);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getVariableDeclarations(const char* prefix, const _variables& variables,
														const char* layout_qualifier)
{
	std::stringstream result_sstream;

	/* Define output variables */
	const size_t n_variables = variables.size();

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size  = variables[n_variable].array_size;
		Utils::_variable_type variable_type		   = variables[n_variable].type;
		std::string			  variable_type_string = Utils::getVariableTypeString(variable_type);

		result_sstream << layout_qualifier << " " << variable_type_string << " " << prefix << "_variable" << n_variable;

		if (variable_array_size > 1)
		{
			result_sstream << "[" << variable_array_size << "]";
		}

		result_sstream << ";\n";
	} /* for (all user-specified variable types) */

	return result_sstream.str();
}